

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesBodyOwnMass.cpp
# Opt level: O2

void __thiscall
chrono::ChVariablesBodyOwnMass::MultiplyAndAdd
          (ChVariablesBodyOwnMass *this,ChVectorRef *result,ChVectorConstRef vect,double c_a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  Scalar *pSVar14;
  CoeffReturnType CVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  
  auVar16._0_8_ =
       Eigen::
       DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
       ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                     *)vect,(long)(this->super_ChVariablesBody).super_ChVariables.offset);
  auVar17._0_8_ =
       Eigen::
       DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
       ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                     *)vect,(long)(this->super_ChVariablesBody).super_ChVariables.offset + 1);
  auVar18._0_8_ =
       Eigen::
       DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
       ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                     *)vect,(long)(this->super_ChVariablesBody).super_ChVariables.offset + 2);
  auVar19._0_8_ =
       Eigen::
       DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
       ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                     *)vect,(long)(this->super_ChVariablesBody).super_ChVariables.offset + 3);
  CVar15 = Eigen::
           DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
           ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                         *)vect,(long)(this->super_ChVariablesBody).super_ChVariables.offset + 4);
  auVar20._0_8_ =
       Eigen::
       DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
       ::operator()((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                     *)vect,(long)(this->super_ChVariablesBody).super_ChVariables.offset + 5);
  dVar13 = c_a * this->mass;
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)result,(long)(this->super_ChVariablesBody).super_ChVariables.offset);
  auVar16._8_8_ = 0;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar13;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *pSVar14;
  auVar1 = vfmadd213sd_fma(auVar16,auVar28,auVar1);
  *pSVar14 = auVar1._0_8_;
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)result,(long)(this->super_ChVariablesBody).super_ChVariables.offset + 1)
  ;
  auVar17._8_8_ = 0;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar13;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *pSVar14;
  auVar1 = vfmadd213sd_fma(auVar17,auVar29,auVar2);
  *pSVar14 = auVar1._0_8_;
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)result,(long)(this->super_ChVariablesBody).super_ChVariables.offset + 2)
  ;
  auVar18._8_8_ = 0;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar13;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *pSVar14;
  auVar1 = vfmadd213sd_fma(auVar18,auVar30,auVar3);
  *pSVar14 = auVar1._0_8_;
  auVar19._8_8_ = 0;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       CVar15 * (this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [1];
  auVar1 = vfmadd231sd_fma(auVar31,auVar19,auVar4);
  auVar20._8_8_ = 0;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar1 = vfmadd231sd_fma(auVar1,auVar20,auVar5);
  auVar32._0_8_ = auVar1._0_8_;
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)result,(long)(this->super_ChVariablesBody).super_ChVariables.offset + 3)
  ;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = c_a;
  auVar32._8_8_ = 0;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *pSVar14;
  auVar1 = vfmadd213sd_fma(auVar32,auVar21,auVar6);
  *pSVar14 = auVar1._0_8_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = auVar19._0_8_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       CVar15 * (this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
  auVar1 = vfmadd231sd_fma(auVar33,auVar22,auVar7);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = auVar20._0_8_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar1 = vfmadd231sd_fma(auVar1,auVar23,auVar8);
  auVar34._0_8_ = auVar1._0_8_;
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)result,(long)(this->super_ChVariablesBody).super_ChVariables.offset + 4)
  ;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = c_a;
  auVar34._8_8_ = 0;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *pSVar14;
  auVar1 = vfmadd213sd_fma(auVar34,auVar24,auVar9);
  *pSVar14 = auVar1._0_8_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = auVar19._0_8_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       (this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       CVar15 * (this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [7];
  auVar1 = vfmadd231sd_fma(auVar35,auVar25,auVar10);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = auVar20._0_8_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       (this->inertia).super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar1 = vfmadd231sd_fma(auVar1,auVar26,auVar11);
  auVar36._0_8_ = auVar1._0_8_;
  pSVar14 = Eigen::
            DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
            ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                          *)result,(long)(this->super_ChVariablesBody).super_ChVariables.offset + 5)
  ;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = c_a;
  auVar36._8_8_ = 0;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *pSVar14;
  auVar1 = vfmadd213sd_fma(auVar36,auVar27,auVar12);
  *pSVar14 = auVar1._0_8_;
  return;
}

Assistant:

void ChVariablesBodyOwnMass::MultiplyAndAdd(ChVectorRef result, ChVectorConstRef vect, const double c_a) const {
    // optimized unrolled operations
    double q0 = vect(this->offset + 0);
    double q1 = vect(this->offset + 1);
    double q2 = vect(this->offset + 2);
    double q3 = vect(this->offset + 3);
    double q4 = vect(this->offset + 4);
    double q5 = vect(this->offset + 5);
    double scaledmass = c_a * mass;
    result(this->offset + 0) += scaledmass * q0;
    result(this->offset + 1) += scaledmass * q1;
    result(this->offset + 2) += scaledmass * q2;
    result(this->offset + 3) += c_a * (inertia(0, 0) * q3 + inertia(0, 1) * q4 + inertia(0, 2) * q5);
    result(this->offset + 4) += c_a * (inertia(1, 0) * q3 + inertia(1, 1) * q4 + inertia(1, 2) * q5);
    result(this->offset + 5) += c_a * (inertia(2, 0) * q3 + inertia(2, 1) * q4 + inertia(2, 2) * q5);
}